

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_datetime_digit
          (parser_t<events_aggregator_t> *this)

{
  int iVar1;
  parser_error_t *this_00;
  size_t offset;
  allocator local_39;
  string local_38;
  char local_11;
  parser_t<events_aggregator_t> *ppStack_10;
  char ch;
  parser_t<events_aggregator_t> *this_local;
  
  ppStack_10 = this;
  local_11 = input_stream_t::get(&this->input);
  iVar1 = isdigit((int)local_11);
  if (iVar1 != 0) {
    return local_11;
  }
  this_00 = (parser_error_t *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Bad datetime. Expected digit.",&local_39);
  offset = last_char_offset(this);
  parser_error_t::parser_error_t(this_00,&local_38,offset);
  __cxa_throw(this_00,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

char parse_datetime_digit() {
        char ch = input.get();
        if (std::isdigit(ch)) {
            return ch;
        } else {
            throw parser_error_t("Bad datetime. Expected digit.", last_char_offset());
        }
    }